

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence_test.cpp
# Opt level: O1

void __thiscall
jhu::thrax::SentenceTests_ReadAlignedSentencePair_Test::TestBody
          (SentenceTests_ReadAlignedSentencePair_Test *this)

{
  bool bVar1;
  char *in_RCX;
  char *pcVar2;
  string_view line;
  AssertionResult gtest_ar;
  AlignedSentencePair pair;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AlignedSentencePair local_50;
  
  line._M_str = in_RCX;
  line._M_len = (size_t)"foo bar baz\tqux\t0-0 1-0 2-0";
  readAlignedSentencePair<false,false>(&local_50,(thrax *)0x1b,line);
  local_68.data_._0_4_ = 3;
  local_70.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_50.src.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_50.src.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_60,"3","pair.src.size()",(int *)&local_68,(unsigned_long *)&local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
      local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_68.data_._0_4_ = 1;
    local_70.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)local_50.tgt.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.tgt.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_60,"1","pair.tgt.size()",(int *)&local_68,(unsigned_long *)&local_70);
    if (local_60[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
                 ,0x42,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_70.ptr_ + 8))();
        }
        local_70.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_68.data_._0_4_ = 3;
      local_70.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_50.alignment.
                  super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_50.alignment.
                  super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_60,"3","pair.alignment.size()",(int *)&local_68,(unsigned_long *)&local_70);
      if (local_60[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (local_58.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
                   ,0x43,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_70.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_70.ptr_ + 8))();
          }
          local_70.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  if (local_50.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.alignment.
                    super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.alignment.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.alignment.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.tgt.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.tgt.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.tgt.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.tgt.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.src.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.src.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.src.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.src.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SentenceTests, ReadAlignedSentencePair) {
  std::string_view line = "foo bar baz\tqux\t0-0 1-0 2-0";
  auto pair = readAlignedSentencePair<false, false>(line);
  ASSERT_EQ(3, pair.src.size());
  ASSERT_EQ(1, pair.tgt.size());
  ASSERT_EQ(3, pair.alignment.size());
}